

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O0

void cpp_bindgen::_impl::
     add_entity<cpp_bindgen::_impl::fortran_wrapper_traits,void(custom_array::my_array<double>),char_const*&,char_const*&>
               (char *name,char **params,char **params_1)

{
  char **name_00;
  entities *this;
  type local_58;
  generator_t local_40;
  char **local_20;
  char **params_local_1;
  char **params_local;
  char *name_local;
  
  local_20 = params_1;
  params_local_1 = params;
  params_local = (char **)name;
  this = get_entities<cpp_bindgen::_impl::fortran_wrapper_traits>();
  name_00 = params_local;
  std::
  bind<void(&)(std::ostream&,char_const*,char_const*),std::_Placeholder<1>const&,char_const*&,char_const*&>
            (&local_58,fortran_wrapper_traits::generate_entity<void(custom_array::my_array<double>)>
             ,(_Placeholder<1> *)&std::placeholders::_1,params_local_1,local_20);
  std::function<void(std::ostream&,char_const*)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,char_const*,char_const*))(std::ostream&,char_const*,char_const*)>,void>
            ((function<void(std::ostream&,char_const*)> *)&local_40,&local_58);
  entities::add(this,(char *)name_00,&local_40);
  std::function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*)>::~function
            (&local_40);
  return;
}

Assistant:

void add_entity(const char *name, Params &&... params) {
            get_entities<Traits>().add(name,
                std::bind(Traits::template generate_entity<Signature>,
                    std::placeholders::_1,
                    std::forward<Params>(params)...));
        }